

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

int eckey_pub_cmp(EVP_PKEY *a,EVP_PKEY *b)

{
  EC_KEY *key;
  EC_KEY *key_00;
  int iVar1;
  int iVar2;
  EC_GROUP *group;
  EC_POINT *a_00;
  EC_POINT *b_00;
  
  key = (EC_KEY *)a->pkey;
  key_00 = (EC_KEY *)b->pkey;
  group = EC_KEY_get0_group(key_00);
  a_00 = EC_KEY_get0_public_key(key);
  b_00 = EC_KEY_get0_public_key(key_00);
  iVar1 = EC_POINT_cmp(group,a_00,b_00,(BN_CTX *)0x0);
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar2 = (uint)(iVar1 == 1) * 2 + -2;
  }
  return iVar2;
}

Assistant:

static int eckey_pub_cmp(const EVP_PKEY *a, const EVP_PKEY *b) {
  const EC_KEY *a_ec = reinterpret_cast<const EC_KEY *>(a->pkey);
  const EC_KEY *b_ec = reinterpret_cast<const EC_KEY *>(b->pkey);
  const EC_GROUP *group = EC_KEY_get0_group(b_ec);
  const EC_POINT *pa = EC_KEY_get0_public_key(a_ec),
                 *pb = EC_KEY_get0_public_key(b_ec);
  int r = EC_POINT_cmp(group, pa, pb, NULL);
  if (r == 0) {
    return 1;
  } else if (r == 1) {
    return 0;
  } else {
    return -2;
  }
}